

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  LogMessage *pLVar4;
  const_iterator __pos;
  LogFinisher local_71;
  LogMessage local_70;
  _Base_ptr local_38;
  
  bVar2 = ValidateSymbolName(this,name);
  if (bVar2) {
    iVar3 = FindLastLessOrEqual(this,name);
    p_Var1 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
    local_70.message_._M_string_length = (size_type)value;
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      std::__cxx11::string::string((string *)&local_70,(string *)name);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)&this->by_symbol_,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)&local_70);
    }
    else {
      local_38 = iVar3._M_node + 1;
      bVar2 = IsSubSymbol(this,(string *)local_38,name);
      if (bVar2) {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x6e);
        pLVar4 = internal::LogMessage::operator<<(&local_70,"Symbol name \"");
        pLVar4 = internal::LogMessage::operator<<(pLVar4,name);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,"\" conflicts with the existing symbol \"")
        ;
        pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)local_38);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,"\".");
        internal::LogFinisher::operator=(&local_71,pLVar4);
        goto LAB_005e81bc;
      }
      __pos._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
      if ((_Rb_tree_header *)__pos._M_node != p_Var1) {
        bVar2 = IsSubSymbol(this,name,(string *)(__pos._M_node + 1));
        if (bVar2) {
          internal::LogMessage::LogMessage
                    (&local_70,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x7b);
          pLVar4 = internal::LogMessage::operator<<(&local_70,"Symbol name \"");
          pLVar4 = internal::LogMessage::operator<<(pLVar4,name);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4,"\" conflicts with the existing symbol \"");
          pLVar4 = internal::LogMessage::operator<<(pLVar4,(string *)(__pos._M_node + 1));
          pLVar4 = internal::LogMessage::operator<<(pLVar4,"\".");
          internal::LogFinisher::operator=(&local_71,pLVar4);
          goto LAB_005e81bc;
        }
      }
      std::__cxx11::string::string((string *)&local_70,(string *)name);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
      ::
      _M_insert_unique_<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>
                  *)&this->by_symbol_,__pos,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
                  *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
    bVar2 = true;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x5e);
    pLVar4 = internal::LogMessage::operator<<(&local_70,"Invalid symbol name: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,name);
    internal::LogFinisher::operator=(&local_71,pLVar4);
LAB_005e81bc:
    internal::LogMessage::~LogMessage(&local_70);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  typename std::map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter,
                    typename std::map<string, Value>::value_type(name, value));

  return true;
}